

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotErrorBarsHEx<ImPlot::GetterError<unsigned_long_long>>
               (char *label_id,GetterError<unsigned_long_long> *getter)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  ImPlotContext *pIVar4;
  bool bVar5;
  ImU32 col;
  long lVar6;
  ImDrawList *this;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  float fVar11;
  ImVec2 p1;
  ImVec2 p2;
  undefined1 local_98 [8];
  double local_90;
  ImVec2 local_88;
  float local_7c;
  ImVec2 local_78;
  ImVec2 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar5 = BeginItem(label_id,-1);
  if (bVar5) {
    if ((GImPlot->FitThisFrame == true) && (iVar7 = getter->Count, 0 < iVar7)) {
      iVar8 = 0;
      do {
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        uVar1 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
        dVar9 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
        dVar3 = dVar9 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        local_58._8_4_ = SUB84(dVar9,0);
        local_58._0_8_ = dVar3;
        local_58._12_4_ = (int)((ulong)dVar9 >> 0x20);
        uVar1 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
        dVar9 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
        local_90 = dVar9 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        local_68._8_4_ = SUB84(dVar9,0);
        local_68._0_8_ = local_90;
        local_68._12_4_ = (int)((ulong)dVar9 >> 0x20);
        uVar1 = *(unsigned_long_long *)((long)getter->Neg + lVar6);
        uVar2 = *(unsigned_long_long *)((long)getter->Pos + lVar6);
        dVar9 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
        local_48._8_4_ = SUB84(dVar9,0);
        local_48._0_8_ = dVar9 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        local_48._12_4_ = (int)((ulong)dVar9 >> 0x20);
        local_98 = (undefined1  [8])
                   (dVar3 - (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
        FitPoint((ImPlotPoint *)local_98);
        local_98 = (undefined1  [8])((double)local_48._0_8_ + (double)local_58._0_8_);
        local_90 = (double)local_68._0_8_;
        FitPoint((ImPlotPoint *)local_98);
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
    pIVar4 = GImPlot;
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar4->NextItemData).Colors + 4);
    iVar7 = getter->Count;
    if (0 < iVar7) {
      local_7c = (pIVar4->NextItemData).ErrorBarSize;
      fVar11 = local_7c * 0.5;
      iVar8 = 0;
      do {
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        uVar1 = *(unsigned_long_long *)((long)getter->Xs + lVar6);
        dVar9 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
        dVar3 = dVar9 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        local_58._8_4_ = SUB84(dVar9,0);
        local_58._0_8_ = dVar3;
        local_58._12_4_ = (int)((ulong)dVar9 >> 0x20);
        uVar1 = *(unsigned_long_long *)((long)getter->Ys + lVar6);
        dVar10 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
        dVar9 = dVar10 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        local_68._8_4_ = SUB84(dVar10,0);
        local_68._0_8_ = dVar9;
        local_68._12_4_ = (int)((ulong)dVar10 >> 0x20);
        uVar1 = *(unsigned_long_long *)((long)getter->Neg + lVar6);
        uVar2 = *(unsigned_long_long *)((long)getter->Pos + lVar6);
        dVar10 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
        local_48._8_4_ = SUB84(dVar10,0);
        local_48._0_8_ = dVar10 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        local_48._12_4_ = (int)((ulong)dVar10 >> 0x20);
        local_98 = (undefined1  [8])
                   PlotToPixels(dVar3 - (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) -
                                         1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,(int)uVar1) -
                                        4503599627370496.0)),dVar9,-1);
        local_88 = PlotToPixels((double)local_48._0_8_ + (double)local_58._0_8_,
                                (double)local_68._0_8_,-1);
        ImDrawList::AddLine(this,(ImVec2 *)local_98,&local_88,col,
                            (pIVar4->NextItemData).ErrorBarWeight);
        if (0.0 < local_7c) {
          local_70.y = (float)local_98._4_4_ - fVar11;
          local_70.x = (float)local_98._0_4_;
          local_78.x = (float)local_98._0_4_ + 0.0;
          local_78.y = (float)local_98._4_4_ + fVar11;
          ImDrawList::AddLine(this,&local_70,&local_78,col,(pIVar4->NextItemData).ErrorBarWeight);
          local_70.y = local_88.y - fVar11;
          local_70.x = local_88.x;
          local_78.x = local_88.x + 0.0;
          local_78.y = local_88.y + fVar11;
          ImDrawList::AddLine(this,&local_70,&local_78,col,(pIVar4->NextItemData).ErrorBarWeight);
        }
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
    pIVar4 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar4->NextItemData);
    pIVar4->PreviousItem = pIVar4->CurrentItem;
    pIVar4->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotErrorBarsHEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X - e.Neg, e.Y));
                FitPoint(ImPlotPoint(e.X + e.Pos, e.Y));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X - e.Neg, e.Y);
            ImVec2 p2 = PlotToPixels(e.X + e.Pos, e.Y);
            DrawList.AddLine(p1, p2, col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(0, half_whisker), p1 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(0, half_whisker), p2 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}